

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPInternalSourceData::ProcessSDESItem
          (RTPInternalSourceData *this,uint8_t sdesid,uint8_t *data,size_t itemlen,
          RTPTime *receivetime,bool *cnamecollis)

{
  int iVar1;
  size_t local_68;
  size_t oldlen_2;
  size_t oldlen_1;
  size_t oldlen;
  uint8_t *oldcname;
  size_t curlen;
  bool *cnamecollis_local;
  RTPTime *receivetime_local;
  size_t itemlen_local;
  uint8_t *data_local;
  RTPInternalSourceData *pRStack_18;
  uint8_t sdesid_local;
  RTPInternalSourceData *this_local;
  
  *cnamecollis = false;
  curlen = (size_t)cnamecollis;
  cnamecollis_local = (bool *)receivetime;
  receivetime_local = (RTPTime *)itemlen;
  itemlen_local = (size_t)data;
  data_local._7_1_ = sdesid;
  pRStack_18 = this;
  RTPSourceStats::SetLastMessageTime(&(this->super_RTPSourceData).stats,receivetime);
  switch(data_local._7_1_) {
  case '\x01':
    oldlen = (size_t)RTCPSDESInfo::GetCNAME
                               (&(this->super_RTPSourceData).SDESinf,(size_t *)&oldcname);
    if (oldcname == (uint8_t *)0x0) {
      RTCPSDESInfo::SetCNAME
                (&(this->super_RTPSourceData).SDESinf,(uint8_t *)itemlen_local,
                 (size_t)receivetime_local);
      (this->super_RTPSourceData).validated = true;
    }
    else if ((RTPTime *)oldcname == receivetime_local) {
      iVar1 = memcmp((void *)itemlen_local,(void *)oldlen,(size_t)receivetime_local);
      if (iVar1 != 0) {
        *(undefined1 *)curlen = 1;
      }
    }
    else {
      *(undefined1 *)curlen = 1;
    }
    break;
  case '\x02':
    RTCPSDESInfo::GetName(&(this->super_RTPSourceData).SDESinf,&oldlen_1);
    if (oldlen_1 == 0) {
      iVar1 = RTCPSDESInfo::SetName
                        (&(this->super_RTPSourceData).SDESinf,(uint8_t *)itemlen_local,
                         (size_t)receivetime_local);
      return iVar1;
    }
    break;
  case '\x03':
    RTCPSDESInfo::GetEMail(&(this->super_RTPSourceData).SDESinf,&oldlen_2);
    if (oldlen_2 == 0) {
      iVar1 = RTCPSDESInfo::SetEMail
                        (&(this->super_RTPSourceData).SDESinf,(uint8_t *)itemlen_local,
                         (size_t)receivetime_local);
      return iVar1;
    }
    break;
  case '\x04':
    iVar1 = RTCPSDESInfo::SetPhone
                      (&(this->super_RTPSourceData).SDESinf,(uint8_t *)itemlen_local,
                       (size_t)receivetime_local);
    return iVar1;
  case '\x05':
    iVar1 = RTCPSDESInfo::SetLocation
                      (&(this->super_RTPSourceData).SDESinf,(uint8_t *)itemlen_local,
                       (size_t)receivetime_local);
    return iVar1;
  case '\x06':
    RTCPSDESInfo::GetTool(&(this->super_RTPSourceData).SDESinf,&local_68);
    if (local_68 == 0) {
      iVar1 = RTCPSDESInfo::SetTool
                        (&(this->super_RTPSourceData).SDESinf,(uint8_t *)itemlen_local,
                         (size_t)receivetime_local);
      return iVar1;
    }
    break;
  case '\a':
    RTPSourceStats::SetLastNoteTime(&(this->super_RTPSourceData).stats,(RTPTime *)cnamecollis_local)
    ;
    iVar1 = RTCPSDESInfo::SetNote
                      (&(this->super_RTPSourceData).SDESinf,(uint8_t *)itemlen_local,
                       (size_t)receivetime_local);
    return iVar1;
  }
  return 0;
}

Assistant:

int RTPInternalSourceData::ProcessSDESItem(uint8_t sdesid,const uint8_t *data,size_t itemlen,const RTPTime &receivetime,bool *cnamecollis)
{
	*cnamecollis = false;
	
	stats.SetLastMessageTime(receivetime);
	
	switch(sdesid)
	{
	case RTCP_SDES_ID_CNAME:
		{
			size_t curlen;
			uint8_t *oldcname;
			
			// NOTE: we're going to make sure that the CNAME is only set once.
			oldcname = SDESinf.GetCNAME(&curlen);
			if (curlen == 0)
			{
				// if CNAME is set, the source is validated
				SDESinf.SetCNAME(data,itemlen);
				validated = true;
			}
			else // check if this CNAME is equal to the one that is already present
			{
				if (curlen != itemlen)
					*cnamecollis = true;
				else
				{
					if (memcmp(data,oldcname,itemlen) != 0)
						*cnamecollis = true;
				}
			}
		}
		break;
	case RTCP_SDES_ID_NAME:
		{
			size_t oldlen;

            		SDESinf.GetName(&oldlen);
			if (oldlen == 0) // Name not set
				return SDESinf.SetName(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_EMAIL:
		{
			size_t oldlen;

			SDESinf.GetEMail(&oldlen);
			if (oldlen == 0)
				return SDESinf.SetEMail(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_PHONE:
		return SDESinf.SetPhone(data,itemlen);
	case RTCP_SDES_ID_LOCATION:
		return SDESinf.SetLocation(data,itemlen);
	case RTCP_SDES_ID_TOOL:
		{
			size_t oldlen;

			SDESinf.GetTool(&oldlen);
			if (oldlen == 0)
				return SDESinf.SetTool(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_NOTE:
		stats.SetLastNoteTime(receivetime);
		return SDESinf.SetNote(data,itemlen);
	}
	return 0;
}